

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O2

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  long in_FS_OFFSET;
  undefined1 local_170 [8];
  DISASM_OPTIONS options;
  
  options._320_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  memset((DISASM_OPTIONS *)local_170,0,0x148);
  _Var1 = parse_arguments(argc,argv,(DISASM_OPTIONS *)local_170);
  if (_Var1) {
    if (local_170._0_4_ == commandShemu) {
      handle_shemu((PDISASM_OPTIONS)local_170);
    }
    else {
      handle_disasm((PDISASM_OPTIONS)local_170);
    }
    cleanup_context((DISASM_OPTIONS *)local_170);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == options._320_8_) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int 
main(
    _In_ int argc, 
    _In_ char* argv[]
    )
{
    DISASM_OPTIONS options = { 0 };

    // Parse arguments & extract relevant options.
    if (!parse_arguments(argc, argv, &options))
    {
        return -1;
    }

    // Handle the indicated command.
    if (options.Command == commandShemu)
    {
        handle_shemu(&options);
    }
    else
    {
        handle_disasm(&options);
    }

    // Will free any memory allocated during argument parsing, and will close any handles.
    cleanup_context(&options);

    return 0;
}